

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

void __thiscall
CVmDynamicFunc::load_image_data(CVmDynamicFunc *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  ushort uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  ulong __n;
  vm_val_t *val;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  __n = (ulong)*(ushort *)ptr;
  uVar1 = *(ushort *)(ptr + 2);
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                    (G_mem_X->varheap_,__n + (ulong)uVar1 * 4 + 0x30,this);
  val = (vm_val_t *)CONCAT44(extraout_var,iVar2);
  val[2].val.obj = (uint)uVar1;
  *(ulong *)(val + 2) = __n;
  val->typ = VM_NIL;
  val[1].typ = VM_NIL;
  (this->super_CVmObject).ext_ = (char *)val;
  val[1].typ = (int)ptr[4];
  vmb_get_dh_val(ptr + 4,val + 1);
  val->typ = (int)ptr[9];
  vmb_get_dh_val(ptr + 9,val);
  *(vm_obj_id_t *)((long)&val[2].val + (long)val[2].val.intval * 4 + 4) = self;
  memcpy(&val[3].typ + val[2].val.intval,ptr + 0xe,__n);
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      *(uint *)((long)&val[2].val + uVar3 * 4 + 4) = (uint)*(ushort *)(ptr + 0xe + uVar3 * 2 + __n);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return;
}

Assistant:

void CVmDynamicFunc::load_image_data(VMG_ vm_obj_id_t self,
                                     const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the bytecode length */
    size_t bytecode_len = osrp2(ptr);
    ptr += 2;

    /* read the object reference count */
    int obj_ref_cnt = osrp2(ptr);
    ptr += 2;

    /* allocate the extension */
    vm_dynfunc_ext *ext = vm_dynfunc_ext::alloc_ext(
        vmg_ this, bytecode_len, obj_ref_cnt);
    ext_ = (char *)ext;

    /* save the method context object */
    vmb_get_dh(ptr, &ext->method_ctx);
    ptr += VMB_DATAHOLDER;

    /* save the source string value */
    vmb_get_dh(ptr, &ext->src);
    ptr += VMB_DATAHOLDER;

    /* set up the dynamic code prefix header */
    vmb_put_objid(ext->get_prefix_ptr(), self);

    /* copy the byte code */
    memcpy(ext->get_bytecode_ptr(), ptr, bytecode_len);
    ptr += bytecode_len;

    /* load the object reference offsets */
    for (int i = 0 ; i < obj_ref_cnt ; ++i, ptr += 2)
        ext->obj_refs[i] = osrp2(ptr);
}